

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O1

void deqp::gles3::Functional::eval_selection_bvec3(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  int i;
  long lVar3;
  Vector<bool,_3> *pVVar4;
  Vector<bool,_3> res_1;
  Vector<bool,_3> res;
  undefined2 local_5c;
  undefined1 local_5a;
  Vector<float,_3> res_2;
  float local_48 [9];
  undefined8 local_24;
  float local_1c;
  int local_18 [6];
  
  fVar1 = c->in[0].m_data[2];
  local_24 = *(undefined8 *)(c->in[1].m_data + 1);
  local_1c = c->in[1].m_data[0];
  local_48[6] = 0.0;
  local_48[7] = 0.0;
  local_48[8] = 0.0;
  res.m_data[0] = false;
  res.m_data[1] = false;
  res.m_data[2] = false;
  lVar3 = 0;
  do {
    fVar2 = *(float *)((long)&local_24 + lVar3 * 4);
    res.m_data[lVar3] = local_48[lVar3 + 6] <= fVar2 && fVar2 != local_48[lVar3 + 6];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_48[0] = c->in[2].m_data[3];
  local_48[1] = c->in[2].m_data[1];
  local_48[2] = c->in[2].m_data[2];
  local_48[3] = 0.0;
  local_48[4] = 0.0;
  local_48[5] = 0.0;
  res_1.m_data[0] = false;
  res_1.m_data[1] = false;
  res_1.m_data[2] = false;
  lVar3 = 0;
  do {
    res_1.m_data[lVar3] =
         local_48[lVar3 + 3] <= local_48[lVar3] && local_48[lVar3] != local_48[lVar3 + 3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  pVVar4 = &res_1;
  if (0.0 < fVar1) {
    pVVar4 = &res;
  }
  local_5a = pVVar4->m_data[2];
  local_5c = *(undefined2 *)pVVar4->m_data;
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  res_2.m_data[2] = 0.0;
  lVar3 = 0;
  do {
    res_2.m_data[lVar3] = (float)(int)*(char *)((long)&local_5c + lVar3);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_18[2] = 0;
  local_18[3] = 1;
  local_18[4] = 2;
  lVar3 = 2;
  do {
    (c->color).m_data[local_18[lVar3]] = *(float *)((long)&res + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

void eval_selection_bvec3	(ShaderEvalContext& c) { c.color.xyz()	= selection(c.in[0].z() > 0.0f,			greaterThan(c.in[1].swizzle(1, 2, 0), Vec3(0.0f, 0.0f, 0.0f)),			greaterThan(c.in[2].swizzle(3, 1, 2), Vec3(0.0f, 0.0f, 0.0f))).asFloat(); }